

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clients_map.c
# Opt level: O0

piga_status piga_clients_map_add(piga_clients_map *map,int shm_key,char *name,int name_length)

{
  piga_event_queue *queue_00;
  piga_event_queue *queue;
  ulong uStack_38;
  piga_status status;
  size_t i;
  char *pcStack_28;
  int name_length_local;
  char *name_local;
  piga_clients_map *ppStack_18;
  int shm_key_local;
  piga_clients_map *map_local;
  
  uStack_38 = 0;
  while( true ) {
    if (7 < uStack_38) {
      return PIGA_ERROR_NO_SPACE_LEFT_IN_MAP;
    }
    if (map->items[uStack_38].queue == (piga_event_queue *)0x0) break;
    uStack_38 = uStack_38 + 1;
  }
  i._4_4_ = name_length;
  pcStack_28 = name;
  name_local._4_4_ = shm_key;
  ppStack_18 = map;
  piga_clients_map_item_set_name(map->items + uStack_38,name,name_length);
  piga_clients_map_item_set_shm_key(ppStack_18->items + uStack_38,name_local._4_4_);
  queue_00 = (piga_event_queue *)
             piga_event_queue_connect_to_shm
                       (name_local._4_4_,&ppStack_18->items[uStack_38].shm_id,(long)&queue + 4);
  if (queue._4_4_ != PIGA_STATUS_OK) {
    return queue._4_4_;
  }
  piga_clients_map_item_set_queue(ppStack_18->items + uStack_38,queue_00);
  return PIGA_STATUS_OK;
}

Assistant:

piga_status piga_clients_map_add(piga_clients_map* map, int shm_key, const char* name, int name_length)
{
    for(size_t i = 0; i < PIGA_CLIENTS_MAP_ITEM_NUMBER; ++i) {
        if(map->items[i].queue == 0) {
            // This item is still unused.
            piga_clients_map_item_set_name(&map->items[i], name, name_length);
            piga_clients_map_item_set_shm_key(&map->items[i], shm_key);
            
            // Receive the queue.
            piga_status status;
            piga_event_queue *queue;
            queue = piga_event_queue_connect_to_shm(shm_key, &(map->items[i].shm_id), &status);
            if(status != PIGA_STATUS_OK)
                return status;
            
            piga_clients_map_item_set_queue(&map->items[i], queue);
            return PIGA_STATUS_OK;
        }
    }
    return PIGA_ERROR_NO_SPACE_LEFT_IN_MAP; 
}